

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_archiver.cpp
# Opt level: O0

void __thiscall HuffmanArchiver::count_data(HuffmanArchiver *this,istream *in)

{
  bool bVar1;
  long *plVar2;
  mapped_type *pmVar3;
  long *in_RSI;
  unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
  *in_RDI;
  char c;
  key_type *in_stack_ffffffffffffffd8;
  undefined1 local_11;
  long *local_10;
  
  local_10 = in_RSI;
  while( true ) {
    plVar2 = (long *)std::istream::read((char *)local_10,(long)&local_11);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    if (!bVar1) break;
    pmVar3 = std::
             unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
             ::operator[](in_RDI,in_stack_ffffffffffffffd8);
    *pmVar3 = *pmVar3 + 1;
    (in_RDI->_M_h)._M_buckets = (__buckets_ptr)((long)(in_RDI->_M_h)._M_buckets + 1);
  }
  std::ios::clear((long)local_10 + *(long *)(*local_10 + -0x18),0);
  std::istream::seekg((long)local_10,_S_beg);
  return;
}

Assistant:

void HuffmanArchiver::count_data(std::istream &in) {
    char c;
    while (in.read(&c, 1)) {
        _data[c]++;
        num_of_symbols_in++;
    }
    in.clear();
    in.seekg(0, in.beg);
}